

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O0

string * __thiscall
cmMakefile::GetModulesFile(string *__return_storage_ptr__,cmMakefile *this,string *name)

{
  undefined1 local_48 [8];
  string debugBuffer;
  bool system;
  string *name_local;
  cmMakefile *this_local;
  
  std::__cxx11::string::string((string *)local_48);
  GetModulesFile(__return_storage_ptr__,this,name,(bool *)(debugBuffer.field_2._M_local_buf + 0xf),
                 false,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GetModulesFile(const std::string& name) const
  {
    bool system;
    std::string debugBuffer;
    return this->GetModulesFile(name, system, false, debugBuffer);
  }